

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::FileGenerator::Generate(FileGenerator *this,Printer *printer)

{
  int iVar1;
  Printer *this_00;
  bool bVar2;
  int iVar3;
  string *value;
  ulong uVar4;
  char *__s;
  FieldDescriptor *pFVar5;
  Descriptor *pDVar6;
  FileOptions *this_01;
  EnumDescriptor *descriptor;
  ServiceDescriptor *descriptor_00;
  MessageGenerator local_198;
  int local_174;
  undefined1 local_170 [4];
  int i_7;
  int local_14c;
  undefined1 local_148 [4];
  int i_6;
  int local_11c;
  int i_5;
  int local_10c;
  undefined1 local_108 [4];
  int i_4;
  MessageGenerator messageGenerator;
  undefined1 local_e0 [4];
  int i_3;
  int local_a4;
  undefined1 local_a0 [4];
  int i_2;
  int local_7c;
  undefined1 local_78 [4];
  int i_1;
  int local_50;
  int i;
  allocator<char> local_39;
  string local_38;
  Printer *local_18;
  Printer *printer_local;
  FileGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  value = FileDescriptor::name_abi_cxx11_(this->file_);
  io::Printer::Print(printer,
                     "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $filename$\n\n"
                     ,"filename",value);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    io::Printer::Print(local_18,"package $package$;\n\n","package",&this->java_package_);
  }
  io::Printer::Print(local_18,"public final class $classname$ {\n  private $classname$() {}\n",
                     "classname",&this->classname_);
  io::Printer::Indent(local_18);
  this_00 = local_18;
  bVar2 = HasDescriptorMethods(this->file_);
  __s = "Lite";
  if (bVar2) {
    __s = "";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,__s,&local_39);
  io::Printer::Print(this_00,
                     "public static void registerAllExtensions(\n    com.google.protobuf.ExtensionRegistry$lite$ registry) {\n"
                     ,"lite",&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  io::Printer::Indent(local_18);
  for (local_50 = 0; iVar1 = local_50, iVar3 = FileDescriptor::extension_count(this->file_),
      iVar1 < iVar3; local_50 = local_50 + 1) {
    pFVar5 = FileDescriptor::extension(this->file_,local_50);
    ExtensionGenerator::ExtensionGenerator((ExtensionGenerator *)local_78,pFVar5);
    ExtensionGenerator::GenerateRegistrationCode((ExtensionGenerator *)local_78,local_18);
    ExtensionGenerator::~ExtensionGenerator((ExtensionGenerator *)local_78);
  }
  for (local_7c = 0; iVar1 = local_7c, iVar3 = FileDescriptor::message_type_count(this->file_),
      iVar1 < iVar3; local_7c = local_7c + 1) {
    pDVar6 = FileDescriptor::message_type(this->file_,local_7c);
    MessageGenerator::MessageGenerator((MessageGenerator *)local_a0,pDVar6);
    MessageGenerator::GenerateExtensionRegistrationCode((MessageGenerator *)local_a0,local_18);
    MessageGenerator::~MessageGenerator((MessageGenerator *)local_a0);
  }
  io::Printer::Outdent(local_18);
  io::Printer::Print(local_18,"}\n");
  this_01 = FileDescriptor::options(this->file_);
  bVar2 = FileOptions::java_multiple_files(this_01);
  if (!bVar2) {
    for (local_a4 = 0; iVar1 = local_a4, iVar3 = FileDescriptor::enum_type_count(this->file_),
        iVar1 < iVar3; local_a4 = local_a4 + 1) {
      descriptor = FileDescriptor::enum_type(this->file_,local_a4);
      EnumGenerator::EnumGenerator((EnumGenerator *)local_e0,descriptor);
      EnumGenerator::Generate((EnumGenerator *)local_e0,local_18);
      EnumGenerator::~EnumGenerator((EnumGenerator *)local_e0);
    }
    for (messageGenerator.field_generators_.extension_generators_.array_._4_4_ = 0;
        iVar1 = messageGenerator.field_generators_.extension_generators_.array_._4_4_,
        iVar3 = FileDescriptor::message_type_count(this->file_), iVar1 < iVar3;
        messageGenerator.field_generators_.extension_generators_.array_._4_4_ =
             messageGenerator.field_generators_.extension_generators_.array_._4_4_ + 1) {
      pDVar6 = FileDescriptor::message_type
                         (this->file_,
                          messageGenerator.field_generators_.extension_generators_.array_._4_4_);
      MessageGenerator::MessageGenerator((MessageGenerator *)local_108,pDVar6);
      MessageGenerator::GenerateInterface((MessageGenerator *)local_108,local_18);
      MessageGenerator::Generate((MessageGenerator *)local_108,local_18);
      MessageGenerator::~MessageGenerator((MessageGenerator *)local_108);
    }
    bVar2 = HasGenericServices(this->file_);
    if (bVar2) {
      for (local_10c = 0; iVar1 = local_10c, iVar3 = FileDescriptor::service_count(this->file_),
          iVar1 < iVar3; local_10c = local_10c + 1) {
        descriptor_00 = FileDescriptor::service(this->file_,local_10c);
        ServiceGenerator::ServiceGenerator
                  ((ServiceGenerator *)&stack0xfffffffffffffee8,descriptor_00);
        ServiceGenerator::Generate((ServiceGenerator *)&stack0xfffffffffffffee8,local_18);
        ServiceGenerator::~ServiceGenerator((ServiceGenerator *)&stack0xfffffffffffffee8);
      }
    }
  }
  for (local_11c = 0; iVar1 = local_11c, iVar3 = FileDescriptor::extension_count(this->file_),
      iVar1 < iVar3; local_11c = local_11c + 1) {
    pFVar5 = FileDescriptor::extension(this->file_,local_11c);
    ExtensionGenerator::ExtensionGenerator((ExtensionGenerator *)local_148,pFVar5);
    ExtensionGenerator::Generate((ExtensionGenerator *)local_148,local_18);
    ExtensionGenerator::~ExtensionGenerator((ExtensionGenerator *)local_148);
  }
  for (local_14c = 0; iVar1 = local_14c, iVar3 = FileDescriptor::message_type_count(this->file_),
      iVar1 < iVar3; local_14c = local_14c + 1) {
    pDVar6 = FileDescriptor::message_type(this->file_,local_14c);
    MessageGenerator::MessageGenerator((MessageGenerator *)local_170,pDVar6);
    MessageGenerator::GenerateStaticVariables((MessageGenerator *)local_170,local_18);
    MessageGenerator::~MessageGenerator((MessageGenerator *)local_170);
  }
  io::Printer::Print(local_18,"\n");
  bVar2 = HasDescriptorMethods(this->file_);
  if (bVar2) {
    GenerateEmbeddedDescriptor(this,local_18);
  }
  else {
    io::Printer::Print(local_18,"static {\n");
    io::Printer::Indent(local_18);
    for (local_174 = 0; iVar1 = local_174, iVar3 = FileDescriptor::message_type_count(this->file_),
        iVar1 < iVar3; local_174 = local_174 + 1) {
      pDVar6 = FileDescriptor::message_type(this->file_,local_174);
      MessageGenerator::MessageGenerator(&local_198,pDVar6);
      MessageGenerator::GenerateStaticVariableInitializers(&local_198,local_18);
      MessageGenerator::~MessageGenerator(&local_198);
    }
    io::Printer::Outdent(local_18);
    io::Printer::Print(local_18,"}\n");
  }
  io::Printer::Print(local_18,"\n// @@protoc_insertion_point(outer_class_scope)\n");
  io::Printer::Outdent(local_18);
  io::Printer::Print(local_18,"}\n");
  return;
}

Assistant:

void FileGenerator::Generate(io::Printer* printer) {
  // We don't import anything because we refer to all classes by their
  // fully-qualified names in the generated source.
  printer->Print(
    "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
    "// source: $filename$\n"
    "\n",
    "filename", file_->name());
  if (!java_package_.empty()) {
    printer->Print(
      "package $package$;\n"
      "\n",
      "package", java_package_);
  }
  printer->Print(
    "public final class $classname$ {\n"
    "  private $classname$() {}\n",
    "classname", classname_);
  printer->Indent();

  // -----------------------------------------------------------------

  printer->Print(
    "public static void registerAllExtensions(\n"
    "    com.google.protobuf.ExtensionRegistry$lite$ registry) {\n",
    "lite", HasDescriptorMethods(file_) ? "" : "Lite");

  printer->Indent();

  for (int i = 0; i < file_->extension_count(); i++) {
    ExtensionGenerator(file_->extension(i)).GenerateRegistrationCode(printer);
  }

  for (int i = 0; i < file_->message_type_count(); i++) {
    MessageGenerator(file_->message_type(i))
      .GenerateExtensionRegistrationCode(printer);
  }

  printer->Outdent();
  printer->Print(
    "}\n");

  // -----------------------------------------------------------------

  if (!file_->options().java_multiple_files()) {
    for (int i = 0; i < file_->enum_type_count(); i++) {
      EnumGenerator(file_->enum_type(i)).Generate(printer);
    }
    for (int i = 0; i < file_->message_type_count(); i++) {
      MessageGenerator messageGenerator(file_->message_type(i));
      messageGenerator.GenerateInterface(printer);
      messageGenerator.Generate(printer);
    }
    if (HasGenericServices(file_)) {
      for (int i = 0; i < file_->service_count(); i++) {
        ServiceGenerator(file_->service(i)).Generate(printer);
      }
    }
  }

  // Extensions must be generated in the outer class since they are values,
  // not classes.
  for (int i = 0; i < file_->extension_count(); i++) {
    ExtensionGenerator(file_->extension(i)).Generate(printer);
  }

  // Static variables.
  for (int i = 0; i < file_->message_type_count(); i++) {
    // TODO(kenton):  Reuse MessageGenerator objects?
    MessageGenerator(file_->message_type(i)).GenerateStaticVariables(printer);
  }

  printer->Print("\n");

  if (HasDescriptorMethods(file_)) {
    GenerateEmbeddedDescriptor(printer);
  } else {
    printer->Print(
      "static {\n");
    printer->Indent();

    for (int i = 0; i < file_->message_type_count(); i++) {
      // TODO(kenton):  Reuse MessageGenerator objects?
      MessageGenerator(file_->message_type(i))
        .GenerateStaticVariableInitializers(printer);
    }

    printer->Outdent();
    printer->Print(
      "}\n");
  }

  printer->Print(
    "\n"
    "// @@protoc_insertion_point(outer_class_scope)\n");

  printer->Outdent();
  printer->Print("}\n");
}